

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O3

char * emulator_get_log_system_name(LogSystem system)

{
  if (system < NUM_LOG_SYSTEMS) {
    return (char *)(&DAT_00125c48)[system];
  }
  return "<unknown log system>";
}

Assistant:

const char* emulator_get_log_system_name(LogSystem system) {
  switch (system) {
#define V(SHORT_NAME, name, NAME) \
  case LOG_SYSTEM_##NAME:         \
    return #name;
  FOREACH_LOG_SYSTEM(V)
#undef V
    default:
      return "<unknown log system>";
  }
}